

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O1

void sha1_ni_reset(ssh_hash *hash)

{
  hash[-9].vt = (ssh_hashalg *)0x98badcfe10325476;
  hash[-9].binarysink_ = (BinarySink *)0x67452301efcdab89;
  hash[-8].vt = (ssh_hashalg *)0x0;
  hash[-8].binarysink_ = (BinarySink *)0xc3d2e1f000000000;
  hash[-3].vt = (ssh_hashalg *)0x0;
  hash[-3].binarysink_ = (BinarySink *)0x0;
  return;
}

Assistant:

static void sha1_ni_reset(ssh_hash *hash)
{
    sha1_ni *s = container_of(hash, sha1_ni, hash);

    /* Initialise the core vectors in their storage order */
    s->core[0] = _mm_set_epi64x(
        0x67452301efcdab89ULL, 0x98badcfe10325476ULL);
    s->core[1] = _mm_set_epi32(0xc3d2e1f0, 0, 0, 0);

    sha1_block_setup(&s->blk);
}